

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

string * google::protobuf::internal::SubMessagePrefix
                   (string *__return_storage_ptr__,string *prefix,FieldDescriptor *field,int index)

{
  bool bVar1;
  AlphaNum *a;
  AlphaNum local_88;
  string local_58;
  undefined1 local_25;
  int local_24;
  FieldDescriptor *pFStack_20;
  int index_local;
  FieldDescriptor *field_local;
  string *prefix_local;
  string *result;
  
  local_25 = 0;
  local_24 = index;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)prefix;
  prefix_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  bVar1 = FieldDescriptor::is_extension(pFStack_20);
  if (bVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    FieldDescriptor::full_name_abi_cxx11_(pFStack_20);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    FieldDescriptor::name_abi_cxx11_(pFStack_20);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  if (local_24 != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_88,local_24);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_58,(lts_20240722 *)&local_88,a);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(absl::StrCat(index));
    result.append("]");
  }
  result.append(".");
  return result;
}